

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O1

int lj_cdata_get(CTState *cts,CType *s,TValue *o,uint8_t *sp)

{
  uint uVar1;
  int iVar2;
  CTypeID sid;
  lua_Number lVar4;
  ulong uVar3;
  
  uVar1 = s->info;
  if (uVar1 >> 0x1c == 10) {
    iVar2 = lj_cconv_tv_bf(cts,s,o,sp);
    return iVar2;
  }
  if (uVar1 >> 0x1c == 0xb) {
    if (((cts->tab[uVar1 & 0xffff].info & 0x800000) == 0) || (-1 < (int)s->size)) {
      lVar4 = (lua_Number)(int)s->size;
    }
    else {
      lVar4 = (lua_Number)s->size;
    }
    o->n = lVar4;
    return 0;
  }
  sid = uVar1 & 0xffff;
  uVar3 = (ulong)sid;
  uVar1 = cts->tab[uVar3].info;
  if ((uVar1 & 0xf0800000) == 0x20800000) {
    sp = *(uint8_t **)sp;
    sid = uVar1 & 0xffff;
    uVar3 = (ulong)sid;
  }
  iVar2 = lj_cconv_tv_ct(cts,cts->tab + uVar3,sid,o,sp);
  return iVar2;
}

Assistant:

int lj_cdata_get(CTState *cts, CType *s, TValue *o, uint8_t *sp)
{
  CTypeID sid;

  if (ctype_isconstval(s->info)) {
    cdata_getconst(cts, o, s);
    return 0;  /* No GC step needed. */
  } else if (ctype_isbitfield(s->info)) {
    return lj_cconv_tv_bf(cts, s, o, sp);
  }

  /* Get child type of pointer/array/field. */
  lj_assertCTS(ctype_ispointer(s->info) || ctype_isfield(s->info),
	       "pointer or field expected");
  sid = ctype_cid(s->info);
  s = ctype_get(cts, sid);

  /* Resolve reference for field. */
  if (ctype_isref(s->info)) {
    lj_assertCTS(s->size == CTSIZE_PTR, "ref is not pointer-sized");
    sp = *(uint8_t **)sp;
    sid = ctype_cid(s->info);
    s = ctype_get(cts, sid);
  }

  /* Skip attributes. */
  while (ctype_isattrib(s->info))
    s = ctype_child(cts, s);

  return lj_cconv_tv_ct(cts, s, sid, o, sp);
}